

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O1

bool __thiscall
nivalis::anon_unknown_3::Differentiator::diff
          (Differentiator *this,ASTNode **ast,uint32_t diff_arg_id)

{
  pointer *ppAVar1;
  uint32_t uVar2;
  bool bVar3;
  size_type sVar4;
  ASTNode *pAVar5;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *pvVar6;
  uint64_t uVar7;
  _OpCode _Var8;
  ASTNode *pAVar9;
  iterator iVar10;
  vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
  *this_00;
  size_type sVar11;
  pointer pUVar12;
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var13;
  long lVar14;
  int64_t i;
  uint64_t uVar15;
  ulong uVar16;
  ASTNode **ast_00;
  int64_t j;
  uint64_t uVar17;
  undefined4 uVar18;
  uint uVar19;
  undefined4 uVar20;
  ASTNode *tmp;
  ASTNode *tmp1_1;
  ASTNode *tmp1;
  __hashtable *__h;
  ASTNode *elnbptr;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_b8;
  ASTNode local_a0;
  size_type local_90;
  pointer local_88;
  uint64_t local_80;
  ASTNode *local_78;
  uint32_t local_6c;
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_68;
  ulong local_60;
  uint64_t local_58;
  ASTNode *local_50;
  uint64_t local_48;
  long local_40;
  double local_38;
  
  ast_00 = &this->ast_root;
  if (ast != (ASTNode **)0x0) {
    ast_00 = ast;
  }
  pAVar9 = *ast_00;
  uVar2 = pAVar9->opcode;
  pAVar5 = pAVar9 + 1;
  *ast_00 = pAVar5;
  if ((int)uVar2 < 0x4005) {
    if (0x3f < (int)uVar2) {
      uVar16 = (ulong)(uVar2 - 0x41);
      if (uVar2 - 0x41 < 0x25) {
        if ((0x1f800e0000U >> (uVar16 & 0x3f) & 1) == 0) {
          if ((0x18000UL >> (uVar16 & 0x3f) & 1) != 0) {
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,bnz);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,(uint)(uVar2 == 0x50) * 3 + le);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            local_b8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start = *ast_00;
            copy_ast(this,local_b8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,this->out);
            skip_ast((ASTNode **)&local_b8);
            copy_ast(this,local_b8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,this->out);
            begin_thunk(this);
            bVar3 = diff(this,ast_00,diff_arg_id);
            if (!bVar3) {
              return false;
            }
            end_thunk(this);
            begin_thunk(this);
            bVar3 = diff(this,ast_00,diff_arg_id);
            if (!bVar3) {
              return false;
            }
            end_thunk(this);
            return true;
          }
          if (uVar16 == 0) {
            local_a0._0_8_ = pAVar5;
            skip_ast((ASTNode **)&local_a0);
            bVar3 = ast_has_var((ASTNode **)&local_a0,this->var_addr);
            if (bVar3) {
              return false;
            }
            pAVar5 = *ast_00;
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            bVar3 = diff(this,ast_00,diff_arg_id);
            if (!bVar3) {
              return false;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,logb);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            copy_ast(this,*ast_00,this->out);
            copy_ast(this,pAVar5,this->out);
            goto LAB_0012e309;
          }
          goto LAB_0012e2bc;
        }
      }
      else {
LAB_0012e2bc:
        if (4 < uVar2 - 0x4000) {
          if (uVar2 != 0x40) {
            return true;
          }
          local_78 = pAVar5;
          skip_ast(&local_78);
          pAVar9 = local_78;
          bVar3 = ast_has_var(&local_78,this->var_addr);
          pAVar5 = *ast_00;
          if (bVar3) {
            local_b8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
            local_b8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
            local_b8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (ASTNode *)0x0;
            Expr::ASTNode::ASTNode(&local_a0,mul);
            if (local_b8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_b8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>
                        (&local_b8,
                         (iterator)
                         local_b8.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
            }
            else {
              (local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish)->opcode = local_a0.opcode;
              *(undefined4 *)
               &(local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_a0._4_4_;
              *(anon_union_8_3_343d95dd_for_ASTNode_1 *)
               ((long)local_b8.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) = local_a0.field_1;
              local_b8.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)local_b8.
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x10);
            }
            copy_ast(this,pAVar9,&local_b8);
            Expr::ASTNode::ASTNode(&local_a0,logb);
            if (local_b8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_b8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>
                        (&local_b8,
                         (iterator)
                         local_b8.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
            }
            else {
              (local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish)->opcode = local_a0.opcode;
              *(undefined4 *)
               &(local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_a0._4_4_;
              *(anon_union_8_3_343d95dd_for_ASTNode_1 *)
               ((long)local_b8.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) = local_a0.field_1;
              local_b8.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)local_b8.
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x10);
            }
            copy_ast(this,pAVar5,&local_b8);
            skip_ast(ast_00);
            skip_ast(ast_00);
            local_50 = local_b8.
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode(&local_a0,mul);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,&local_a0);
            }
            else {
              (iVar10._M_current)->opcode = local_a0.opcode;
              *(undefined4 *)&(iVar10._M_current)->field_0x4 = local_a0._4_4_;
              (iVar10._M_current)->field_1 = local_a0.field_1;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode(&local_a0,expb);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,&local_a0);
            }
            else {
              (iVar10._M_current)->opcode = local_a0.opcode;
              *(undefined4 *)&(iVar10._M_current)->field_0x4 = local_a0._4_4_;
              (iVar10._M_current)->field_1 = local_a0.field_1;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            copy_ast(this,local_50,this->out);
            bVar3 = diff(this,&local_50,diff_arg_id);
            if (local_b8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
              operator_delete(local_b8.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b8.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b8.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (!bVar3) {
              return false;
            }
            return true;
          }
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
          }
          else {
            *(pointer *)iVar10._M_current =
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar10._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
          }
          else {
            *(pointer *)iVar10._M_current =
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar10._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          copy_ast(this,*ast_00,this->out);
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_b8,power);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
          }
          else {
            *(pointer *)iVar10._M_current =
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar10._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          copy_ast(this,pAVar5,this->out);
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
          }
          else {
            *(pointer *)iVar10._M_current =
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar10._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          copy_ast(this,*ast_00,this->out);
          pvVar6 = this->out;
          uVar19 = 0x3ff00000;
          goto LAB_0012e034;
        }
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,0.0);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      skip_ast(ast_00);
      goto LAB_0012e309;
    }
    if (0x1f < (int)uVar2) {
      if ((int)uVar2 < 0x31) {
        if (uVar2 - 0x20 < 2) {
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_b8,uVar2,0xffffffffffffffff);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
          }
          else {
            *(pointer *)iVar10._M_current =
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar10._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          goto LAB_0012f909;
        }
        if (uVar2 != 0x30) {
          return true;
        }
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
        iVar10._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
        }
        else {
          *(pointer *)iVar10._M_current =
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar10._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        pAVar5 = *ast_00;
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
        iVar10._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
        }
        else {
          *(pointer *)iVar10._M_current =
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar10._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        bVar3 = diff(this,ast_00,diff_arg_id);
        if (!bVar3) {
          return false;
        }
        copy_ast(this,*ast_00,this->out);
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
        iVar10._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
        }
        else {
          *(pointer *)iVar10._M_current =
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar10._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        bVar3 = diff(this,ast_00,diff_arg_id);
        if (!bVar3) {
          return false;
        }
        goto LAB_001305cc;
      }
      if (uVar2 != 0x31) {
        if (uVar2 != 0x32) {
          return true;
        }
        bVar3 = diff(this,ast_00,diff_arg_id);
        if (!bVar3) {
          return false;
        }
        bVar3 = ast_has_var(ast_00,this->var_addr);
        if (bVar3) {
          return false;
        }
        return true;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pAVar9 = *ast_00;
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      pAVar5 = *ast_00;
      copy_ast(this,pAVar5,this->out);
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      copy_ast(this,pAVar9,this->out);
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sqrb);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pvVar6 = this->out;
      goto LAB_001305d9;
    }
    switch(uVar2) {
    case 0:
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,null);
      goto LAB_001304ad;
    case 1:
      pvVar6 = this->out;
      uVar19 = 0;
      break;
    case 2:
      pvVar6 = this->out;
      if ((pAVar9->field_1).ref == this->var_addr) {
        uVar19 = 0x3ff00000;
      }
      else {
        uVar19 = 0;
      }
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,(double)((ulong)uVar19 << 0x20));
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current !=
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
        return true;
      }
      goto LAB_001304d0;
    case 3:
      pvVar6 = this->out;
      if ((pAVar9->field_1).ref == (ulong)diff_arg_id) {
        uVar19 = 0x3ff00000;
      }
      else {
        uVar19 = 0;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
      goto LAB_001305e0;
    case 0xc:
      uVar19 = (pAVar9->field_1).call_info[0];
      pUVar12 = (this->env).funcs.
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_90 = pUVar12[uVar19].n_args;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &pUVar12[uVar19].expr.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>;
      sVar4 = std::
              _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->vis_asts)._M_h,(key_type *)&local_b8);
      sVar11 = local_90;
      if (sVar4 != 0) {
        return false;
      }
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88 = pUVar12;
      local_68 = &(this->vis_asts)._M_h;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::resize((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                *)&local_b8,local_90);
      if (sVar11 != 0) {
        pAVar5 = *ast_00;
        lVar14 = 0;
        sVar11 = local_90;
        do {
          pAVar5 = copy_ast(this,pAVar5,
                            (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)((long)&(local_b8.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar14)
                           );
          lVar14 = lVar14 + 0x18;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
      std::
      vector<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>,std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>>
      ::
      emplace_back<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>
                ((vector<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>,std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>>
                  *)&this->argv,
                 (vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                  *)&local_b8);
      pUVar12 = local_88 + uVar19;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::~vector((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                 *)&local_b8);
      if (local_90 != 0) {
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
        iVar10._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
        }
        else {
          *(pointer *)iVar10._M_current =
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar10._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      p_Var13 = local_68;
      local_a0._0_8_ =
           *(undefined8 *)
            &(pUVar12->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl;
      local_78 = *(ASTNode **)
                  &(pUVar12->expr).ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
      std::
      _Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<nivalis::Expr::ASTNode_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<nivalis::Expr::ASTNode_const*,false>>>>
                ((_Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_68);
      bVar3 = diff(this,(ASTNode **)&local_a0,0xffffffff);
      if (!bVar3) {
        return false;
      }
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &(pUVar12->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl;
      local_88 = pUVar12;
      std::
      _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(p_Var13);
      if (local_90 != 0) {
        local_60 = local_90 - 1;
        uVar16 = 0;
        local_6c = diff_arg_id;
        do {
          uVar2 = local_6c;
          if (uVar16 < local_60) {
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
            iVar10._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
            }
            else {
              *(pointer *)iVar10._M_current =
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar10._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
          }
          else {
            *(pointer *)iVar10._M_current =
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar10._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_b8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          pUVar12 = local_88;
          bVar3 = diff(this,ast_00,uVar2);
          p_Var13 = local_68;
          if (!bVar3) {
            return false;
          }
          local_a0._0_8_ =
               *(undefined8 *)
                &(pUVar12->expr).ast.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl;
          local_78 = *(ASTNode **)
                      &(pUVar12->expr).ast.
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       ._M_impl;
          local_b8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
          local_80 = uVar16;
          std::
          _Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<nivalis::Expr::ASTNode_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<nivalis::Expr::ASTNode_const*,false>>>>
                    ((_Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_68,&local_78,&local_b8);
          uVar15 = local_80;
          bVar3 = diff(this,(ASTNode **)&local_a0,(uint32_t)local_80);
          if (!bVar3) {
            return false;
          }
          local_b8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                &(pUVar12->expr).ast.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl;
          std::
          _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(p_Var13,&local_b8);
          uVar16 = uVar15 + 1;
        } while (local_90 != uVar16);
      }
      this_00 = (this->argv).
                super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->argv).
      super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::~vector(this_00);
      return true;
    case 0x10:
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,bnz);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pAVar5 = copy_ast(this,*ast_00,this->out);
      *ast_00 = pAVar5;
      if (pAVar5->opcode != 8) {
        return false;
      }
      *ast_00 = pAVar5 + 1;
      begin_thunk(this);
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      end_thunk(this);
      pAVar5 = *ast_00;
      if (pAVar5->opcode != 9) {
        return false;
      }
      *ast_00 = pAVar5 + 1;
      if (pAVar5[1].opcode != 8) {
        return false;
      }
      *ast_00 = pAVar5 + 2;
      begin_thunk(this);
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      end_thunk(this);
      if ((*ast_00)->opcode != 9) {
        return false;
      }
      *ast_00 = *ast_00 + 1;
      return true;
    case 0x11:
      p_Var13 = (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(pAVar9->field_1).ref;
      if (p_Var13 ==
          (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)this->var_addr) {
        return false;
      }
      if (pAVar5->opcode != 1) {
        return false;
      }
      uVar15 = (uint64_t)pAVar9[1].field_1.val;
      *ast_00 = pAVar9 + 2;
      if (pAVar9[2].opcode != 1) {
        return false;
      }
      local_80 = (uint64_t)pAVar9[2].field_1.val;
      *ast_00 = pAVar9 + 3;
      if (pAVar9[3].opcode != 8) {
        return false;
      }
      local_88 = (pointer)((ulong)((long)uVar15 <= (long)local_80) * 2 - 1);
      local_90 = (local_80 + (ulong)((long)uVar15 <= (long)local_80) * 2) - 1;
      *ast_00 = pAVar9 + 4;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68 = p_Var13;
      do {
        if (local_90 == uVar15) {
          skip_ast(ast_00);
          goto LAB_00130a2f;
        }
        local_78 = *ast_00;
        if (local_80 != uVar15) {
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode(&local_a0,add);
          iVar10._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,&local_a0);
            p_Var13 = local_68;
          }
          else {
            (iVar10._M_current)->opcode = local_a0.opcode;
            *(undefined4 *)&(iVar10._M_current)->field_0x4 = local_a0._4_4_;
            (iVar10._M_current)->field_1 = local_a0.field_1;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
            p_Var13 = local_68;
          }
        }
        (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(long)p_Var13] = (double)(long)uVar15;
        if (local_b8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_b8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_b8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_b8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        ast_sub_var(&local_78,(uint64_t)p_Var13,(double)(long)uVar15,&local_b8);
        local_78 = local_b8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = diff(this,&local_78,diff_arg_id);
        uVar15 = uVar15 + (long)local_88;
      } while (bVar3);
      goto LAB_00130c08;
    case 0x12:
      uVar15 = (pAVar9->field_1).ref;
      if (uVar15 == this->var_addr) {
        return false;
      }
      if (pAVar5->opcode != 1) {
        return false;
      }
      local_58 = (uint64_t)pAVar9[1].field_1.val;
      *ast_00 = pAVar9 + 2;
      if (pAVar9[2].opcode != 1) {
        return false;
      }
      local_90 = (size_type)pAVar9[2].field_1.val;
      *ast_00 = pAVar9 + 3;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
      local_b8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_6c = diff_arg_id;
      if (pAVar9[3].opcode == 8) {
        local_80 = (ulong)((long)local_58 <= (long)local_90) * 2 - 1;
        local_68 = (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_80 + local_90);
        *ast_00 = pAVar9 + 4;
        if (local_68 !=
            (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_58) {
          lVar14 = 0;
          uVar7 = local_58;
          local_60 = uVar15;
          do {
            uVar17 = local_58;
            local_88 = (pointer)uVar7;
            if (uVar7 != local_90) {
              pvVar6 = this->out;
              Expr::ASTNode::ASTNode(&local_a0,add);
              iVar10._M_current =
                   (pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (pvVar6->
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,&local_a0);
                uVar15 = local_60;
              }
              else {
                (iVar10._M_current)->opcode = local_a0.opcode;
                *(undefined4 *)&(iVar10._M_current)->field_0x4 = local_a0._4_4_;
                (iVar10._M_current)->field_1 = local_a0.field_1;
                ppAVar1 = &(pvVar6->
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppAVar1 = *ppAVar1 + 1;
                uVar15 = local_60;
              }
            }
            local_48 = local_80 + (long)local_88;
            local_38 = (double)(long)local_88;
            local_40 = lVar14;
            do {
              if (local_90 != uVar17) {
                pvVar6 = this->out;
                Expr::ASTNode::ASTNode(&local_a0,mul);
                iVar10._M_current =
                     (pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (pvVar6->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,&local_a0);
                  uVar15 = local_60;
                }
                else {
                  (iVar10._M_current)->opcode = local_a0.opcode;
                  *(undefined4 *)&(iVar10._M_current)->field_0x4 = local_a0._4_4_;
                  (iVar10._M_current)->field_1 = local_a0.field_1;
                  ppAVar1 = &(pvVar6->
                             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppAVar1 = *ppAVar1 + 1;
                  uVar15 = local_60;
                }
              }
              if (lVar14 == 0) {
                (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15] = local_38;
                if (local_b8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_b8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  local_b8.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_b8.
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                local_a0._0_8_ = *ast_00;
                ast_sub_var((ASTNode **)&local_a0,uVar15,(double)(long)uVar17,&local_b8);
                local_a0._0_8_ =
                     local_b8.
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                bVar3 = diff(this,(ASTNode **)&local_a0,local_6c);
                if (!bVar3) goto LAB_00130c08;
              }
              else {
                local_a0._0_8_ = *ast_00;
                ast_sub_var((ASTNode **)&local_a0,uVar15,(double)(long)uVar17,this->out);
              }
              uVar17 = uVar17 + local_80;
              lVar14 = lVar14 + local_80;
            } while (local_68 !=
                     (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)uVar17);
            lVar14 = local_40 - local_80;
            uVar7 = local_48;
          } while (local_88 != (pointer)local_90);
        }
        skip_ast(ast_00);
LAB_00130a2f:
        if ((*ast_00)->opcode == 9) {
          *ast_00 = *ast_00 + 1;
          if (local_b8.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_start == (ASTNode *)0x0) {
            return true;
          }
          operator_delete(local_b8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          return true;
        }
      }
LAB_00130c08:
      if (local_b8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start == (ASTNode *)0x0) {
        return false;
      }
      operator_delete(local_b8.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return false;
    default:
      if (uVar2 != 0x18) {
        return true;
      }
      skip_ast(ast_00);
      goto LAB_0012f909;
    }
    goto LAB_001304a8;
  }
  switch(uVar2) {
  case 0x8000:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,unaryminus);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    goto LAB_0012f909;
  case 0x8001:
  case 0x8005:
  case 0x8006:
  case 0x8007:
  case 0x8008:
  case 0x800e:
    pvVar6 = this->out;
    uVar19 = 0;
LAB_0012e034:
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,(double)((ulong)uVar19 << 0x20));
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
LAB_0012e309:
    skip_ast(ast_00);
    return true;
  case 0x8002:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sgn;
    goto LAB_0012f8cd;
  case 0x8003:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,0.5);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,power);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    uVar19 = 0xbfe00000;
    goto LAB_001304a8;
  case 0x8004:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = mul;
    goto LAB_0012f9b4;
  case 0x8009:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = expb;
    break;
  case 0x800a:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,0.6931471805599453);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = exp2b;
    break;
  case 0x800b:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0;
    uVar20 = 0x3ff00000;
    goto LAB_00130436;
  case 0x800c:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0xbbb55516;
    uVar20 = 0x40026bb1;
    goto LAB_00130436;
  case 0x800d:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0xfefa39ef;
    uVar20 = 0x3fe62e42;
    goto LAB_00130436;
  case 0x800f:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = cosb;
    break;
  case 0x8010:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,unaryminus);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sinb;
    break;
  case 0x8011:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,power);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,cosb);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    uVar19 = 0xc0000000;
LAB_001304a8:
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,(double)((ulong)uVar19 << 0x20));
LAB_001304ad:
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current !=
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
      return true;
    }
LAB_001304d0:
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    return true;
  case 0x8012:
  case 0x8013:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    if (uVar2 == 0x8013) {
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,unaryminus);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sqrtb);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sqrb);
LAB_001309e2:
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    if (bVar3 != false) {
      return true;
    }
    return false;
  case 0x8014:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,divi);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    goto LAB_0013056e;
  case 0x8015:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = coshb;
    break;
  case 0x8016:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = sinhb;
    break;
  case 0x8017:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sqrb);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = tanhb;
    break;
  case 0x8018:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,tgammab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    goto LAB_0012fe2f;
  case 0x8019:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
LAB_0012fe2f:
    pvVar6 = this->out;
    _Var8 = digammab;
    break;
  case 0x801a:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = trigammab;
    break;
  case 0x801b:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = polygammab;
LAB_0012f9b4:
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,_Var8);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0;
    uVar20 = 0x40000000;
LAB_00130436:
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,(double)CONCAT44(uVar20,uVar18));
    goto LAB_001305a7;
  case 0x801c:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.1283791670955126);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,expb);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,unaryminus);
LAB_0013056e:
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sqrb;
    break;
  case 0x801d:
    goto LAB_001305e0;
  case 0x801e:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sigmoidb);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,*ast_00,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
    goto LAB_0012f7f6;
  case 0x801f:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
LAB_0012f7f6:
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sigmoidb;
    goto LAB_0012f8cd;
  case 0x8020:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,unaryminus);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,*ast_00,this->out);
    pvVar6 = this->out;
    _Var8 = gausspdfb;
LAB_0012f8cd:
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,_Var8);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pAVar9 = *ast_00;
    pvVar6 = this->out;
LAB_0012f904:
    copy_ast(this,pAVar9,pvVar6);
LAB_0012f909:
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (bVar3) {
      return true;
    }
LAB_001305e0:
    return false;
  default:
    if (uVar2 != 0x4005) {
      if (uVar2 != 0x4006) {
        return true;
      }
      local_a0._0_8_ = pAVar5;
      bVar3 = ast_has_var((ASTNode **)&local_a0,this->var_addr);
      if (bVar3) {
        return false;
      }
      pAVar9 = *ast_00;
      local_a0._0_8_ = pAVar9;
      skip_ast(ast_00);
      pAVar5 = *ast_00;
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,polygammab);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
      iVar10._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
      }
      else {
        *(pointer *)iVar10._M_current =
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar10._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_b8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      copy_ast(this,pAVar9,this->out);
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_b8,1.0);
      goto LAB_001309e2;
    }
    local_a0._0_8_ = pAVar5;
    skip_ast((ASTNode **)&local_a0);
    pAVar9 = (ASTNode *)local_a0._0_8_;
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,betab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    copy_ast(this,pAVar9,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,digammab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,digammab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    copy_ast(this,pAVar9,this->out);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,mul);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,betab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    copy_ast(this,pAVar9,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,sub);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,digammab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar9,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,digammab);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_b8,add);
    iVar10._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
    }
    else {
      *(pointer *)iVar10._M_current =
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar10._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_b8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    goto LAB_0012f904;
  }
  Expr::ASTNode::ASTNode((ASTNode *)&local_b8,_Var8);
LAB_001305a7:
  iVar10._M_current =
       (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar10._M_current ==
      (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar10,(ASTNode *)&local_b8);
  }
  else {
    *(pointer *)iVar10._M_current =
         local_b8.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_start;
    (iVar10._M_current)->field_1 =
         (anon_union_8_3_343d95dd_for_ASTNode_1)
         local_b8.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_finish;
    ppAVar1 = &(pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
LAB_001305cc:
  pvVar6 = this->out;
LAB_001305d9:
  copy_ast(this,pAVar5,pvVar6);
LAB_001305e0:
  return true;
}

Assistant:

bool diff(const Expr::ASTNode** ast = nullptr, uint32_t diff_arg_id = -1) {
        if (ast == nullptr) ast = &ast_root;
        using namespace OpCode;
        uint32_t opcode = (*ast)->opcode;
        // std::cout << opcode << " " << diff_arg_id << " " << out.size() << " :: ";
        // for (auto& i : out) { std::cout << i.opcode << " "; }
        // std::cout << "\n";
        ++*ast;
        switch(opcode) {
            case null: PUSH(null); break;
            case val: PUSH(0.); break;
            case ref: PUSH(((*ast)-1)->ref == var_addr ? 1. : 0.); break;
            case arg: PUSH(((*ast)-1)->ref == diff_arg_id ? 1. : 0.); break;
            case call:
                      {
                          uint32_t fid = ((*ast)-1)->call_info[0];
                          size_t n_args = env.funcs[fid].n_args;

                          const auto& fexpr = env.funcs[fid].expr;
                          if (vis_asts.count(&fexpr.ast[0])) {
                              // Prevent recursion/cycles
                              return false;
                          }
                          {
                              std::vector<Expr::AST> call_args;
                              call_args.resize(n_args);
                              const Expr::ASTNode* tmp = *ast;
                              for (size_t i = 0; i < n_args; ++i) {
                                  tmp = copy_ast(tmp, call_args[i]);
                              }
                              argv.push_back(std::move(call_args));
                          }
                          {
                              if (n_args > 0) out.push_back(add);
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr)) {
                                  return false;
                              }
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          for (size_t i = 0; i < n_args; ++i) {
                              if (i < n_args - 1) out.push_back(add);
                              out.push_back(mul);
                              DIFF_NEXT;
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr, (uint32_t)i)) return false;
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          argv.pop_back();
                      }
                      break;
            case bnz:
                      {
                          PUSH(bnz);
                          *ast = copy_ast(*ast, out);
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case sums:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          Expr::AST diff_tmp;
                          for (int64_t i = a; i != b; i += step) {
                              const Expr::ASTNode* tmp = *ast;
                              if (i + step != b) PUSH(OpCode::add);
                              env.vars[var_id] = static_cast<double>(i);
                              diff_tmp.clear();
                              ast_sub_var(&tmp, var_id, static_cast<double>(i), diff_tmp);
                              tmp = &diff_tmp[0];
                              if (!diff(&tmp, diff_arg_id)) return false;
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case prods:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          Expr::AST diff_tmp;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          for (int64_t i = a; i != b; i += step) {
                              if (i + step != b) PUSH(OpCode::add);
                              for (int64_t j = a; j != b; j += step) {
                                  if (j + step != b) PUSH(OpCode::mul);
                                  if (j == i) {
                                      env.vars[var_id] = static_cast<double>(i);
                                      diff_tmp.clear();
                                      const Expr::ASTNode* tmp = *ast;
                                      ast_sub_var(&tmp, var_id, static_cast<double>(j), diff_tmp);
                                      tmp = &diff_tmp[0];
                                      if (!diff(&tmp, diff_arg_id)) return false;
                                  } else {
                                      const Expr::ASTNode* tmp2 = *ast;
                                      ast_sub_var(&tmp2, var_id, static_cast<double>(j), out);
                                  }
                              }
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;

            case bsel: skip_ast(ast); DIFF_NEXT; break;
            case add: case sub: PUSH(opcode); DIFF_NEXT; DIFF_NEXT; break;
            case mul: {
                          // Product rule
                          PUSH(add);
                          const Expr::ASTNode* tmp1 = *ast;
                          PUSH(mul); DIFF_NEXT; // df *
                          copy_ast(*ast, out); // g
                          PUSH(mul);
                          DIFF_NEXT;
                          copy_ast(tmp1, out); // + dg * f
                      }
                break;
            case divi: {
                          // Quotient rule
                          PUSH(divi); PUSH(sub);
                          const Expr::ASTNode* tmp1 = *ast, *tmp1b = *ast;
                          PUSH(mul); DIFF_NEXT;  // df *
                          const Expr::ASTNode* tmp2 = *ast;
                          copy_ast(tmp2, out);  // g
                          PUSH(mul); DIFF_NEXT; copy_ast(tmp1, out); // - dg * f
                          tmp1 = tmp1b;
                          PUSH(sqrb); copy_ast(tmp2, out); // / g^2
                      }
                      break;
            case mod:
                      DIFF_NEXT;
                      // Cannot take derivative wrt modulus
                      if (ast_has_var(ast, var_addr)) return false;
                      break;

            case power:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          skip_ast(&tmp1);
                          const Expr::ASTNode* expon_pos = tmp1;
                          bool expo_nonconst = ast_has_var(&tmp1, var_addr);
                          if (expo_nonconst) {
                              const Expr::ASTNode* base_pos = *ast;
                              Expr::AST elnb;
                              elnb.push_back(mul);
                              copy_ast(expon_pos, elnb);
                              elnb.push_back(logb);
                              copy_ast(base_pos, elnb);
                              skip_ast(ast); skip_ast(ast);
                              const Expr::ASTNode* elnbptr = &elnb[0];
                              PUSH(mul); PUSH(expb);
                              copy_ast(elnbptr, out);
                              if (!diff(&elnbptr, diff_arg_id)) return false;
                          } else {
                              CHAIN_RULE(PUSH(mul);
                                      copy_ast(*ast, out);
                                      PUSH(power), // g(x) goes here
                                      PUSH(sub); copy_ast(*ast, out); PUSH(1.));
                              skip_ast(ast);
                          }
                      }
                      break;
            case logbase:
                      {
                          const Expr::ASTNode* tmp = *ast;
                          skip_ast(&tmp);
                          bool base_nonconst = ast_has_var(&tmp, var_addr);
                          // Cannot take derivative wrt base
                          if (base_nonconst) return false;
                          CHAIN_RULE(PUSH(divi);
                                  PUSH(1.0);PUSH(mul);
                                  PUSH(logb);
                                  copy_ast(*ast, out),);
                          skip_ast(ast);
                      }
                      break;
            case max: case min:
                      {
                          PUSH(bnz); PUSH(opcode == max ? ge : le);
                          const Expr::ASTNode* tmp = *ast;
                          copy_ast(tmp, out);
                          skip_ast(&tmp); copy_ast(tmp, out);
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          break;
                      }
            case land: case lor: case lxor: case gcd: case lcm: case choose: case fafact: case rifact:
            case lt: case le: case eq: case ne: case ge: case gt:
                      PUSH(0.0); skip_ast(ast); skip_ast(ast); // Integer functions: 0 derivative
                      break;
            case betab:
                      {
                          const Expr::ASTNode* tmp = *ast, *x_pos = *ast;
                          skip_ast(&tmp);
                          const Expr::ASTNode* y_pos = tmp;
                          PUSH(add);
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(x_pos,out);
                          PUSH(digammab); PUSH(add);
                          copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(y_pos,out);
                          PUSH(digammab); PUSH(add); copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                      }
                      break;
            case polygammab:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          bool idx_nonconst = ast_has_var(&tmp1, var_addr);
                          if (idx_nonconst) return false; // Can't differentiate wrt polygamma index
                          tmp1 = *ast;
                          skip_ast(ast);
                          CHAIN_RULE(PUSH(polygammab);
                                  PUSH(add);
                                  copy_ast(tmp1, out);
                                  PUSH(1.),);
                      }
                      break;
            case unaryminus: PUSH(unaryminus); DIFF_NEXT; break;
            case absb: {
                           PUSH(mul); PUSH(sgn);
                           copy_ast(*ast, out);
                           DIFF_NEXT;
                       }
                             break;
            case sqrtb: CHAIN_RULE(
                                PUSH(mul);
                                PUSH(0.5);
                                PUSH(power), // g(x) goes here
                                PUSH(-0.5)); break;
            case sqrb: CHAIN_RULE(PUSH(mul); PUSH(2.),); break;
            case lnot: case sgn: case floorb: case ceilb: case roundb: case factb:
                       PUSH(0.0); skip_ast(ast); break; // Integer functions; 0 derivative
            case expb: CHAIN_RULE(PUSH(expb),); break;
            case exp2b: CHAIN_RULE( PUSH(mul); PUSH(log(2.)); PUSH(exp2b),); break;
            case logb:  CHAIN_RULE(PUSH(divi);PUSH(1.0),); break;
            case log2b:  CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(2));,); break;
            case log10b: CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(10));,); break;
            case sinb:  CHAIN_RULE(PUSH(cosb),); break;
            case cosb:  CHAIN_RULE(PUSH(unaryminus); PUSH(sinb),); break;
            case tanb:  CHAIN_RULE(PUSH(power); PUSH(cosb);
                                ,PUSH(-2.)); break;
            case asinb: case acosb:
                        CHAIN_RULE(if (opcode == acosb) PUSH(unaryminus);
                                PUSH(divi); PUSH(1.);
                                PUSH(sqrtb); PUSH(sub); PUSH(1.); PUSH(sqrb),); break;
            case atanb:  CHAIN_RULE(PUSH(divi); PUSH(1.); PUSH(add); PUSH(1.); PUSH(sqrb),); break;
            case sinhb: CHAIN_RULE(PUSH(coshb),); break;
            case coshb: CHAIN_RULE(PUSH(sinhb),); break;
            case tanhb: CHAIN_RULE(PUSH(sub); PUSH(1.); PUSH(sqrb); PUSH(tanhb),); break;
            case tgammab:
                        {
                            const Expr::ASTNode* tmp = *ast;
                            out.push_back(mul); DIFF_NEXT;
                            PUSH(mul); PUSH(tgammab); copy_ast(tmp, out);
                            PUSH(digammab); copy_ast(tmp, out);
                        }
                        break;
            case digammab: CHAIN_RULE(PUSH(trigammab),); break;
            case trigammab: CHAIN_RULE(PUSH(polygammab); PUSH(2.),); break;
            case lgammab: CHAIN_RULE(PUSH(digammab),); break;
            case erfb:   CHAIN_RULE(
                                 PUSH(mul); PUSH(2.0 / sqrt(M_PI));
                                 PUSH(expb); PUSH(unaryminus); PUSH(sqrb),);
                         break;
            case sigmoidb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            PUSH(sub);
                            PUSH(1.);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                        ; 
                        break;
            case softplusb: 
                         {
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case gausspdfb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(unaryminus);
                            copy_ast(*ast, out);
                            PUSH(gausspdfb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case zetab:  return false; // Derivative not available
        }
        return true;
    }